

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int SDL_CDPlayTracks(SDL12_CD *cdrom,int start_track,int start_frame,int ntracks,int nframes)

{
  int iVar1;
  SDL12_CD *cdrom_00;
  Uint32 local_28;
  int local_24;
  int nframes_local;
  int ntracks_local;
  int start_frame_local;
  int start_track_local;
  SDL12_CD *cdrom_local;
  
  cdrom_00 = ValidCDDevice(cdrom);
  if (cdrom_00 == (SDL12_CD *)0x0) {
    cdrom_local._4_4_ = -1;
  }
  else if (cdrom_00->status == SDL12_CD_TRAYEMPTY) {
    cdrom_local._4_4_ = (*SDL20_SetError)("Tray empty");
  }
  else if ((start_track < 0) || (cdrom_00->numtracks <= start_track)) {
    cdrom_local._4_4_ = (*SDL20_SetError)("Invalid start track");
  }
  else {
    if ((-1 < start_frame) && ((uint)start_frame < cdrom_00->track[start_track].length)) {
      if ((-1 < ntracks) && (start_track + ntracks < cdrom_00->numtracks)) {
        if ((-1 < nframes) && ((uint)nframes < cdrom_00->track[start_track + ntracks].length)) {
          local_28 = nframes;
          local_24 = ntracks;
          if ((ntracks == 0) && (nframes == 0)) {
            local_24 = cdrom_00->numtracks - start_track;
            local_28 = cdrom_00->track[cdrom_00->numtracks + -1].length;
          }
          iVar1 = StartCDAudioPlaying(cdrom_00,start_track,start_frame,local_24,local_28);
          return iVar1;
        }
        iVar1 = (*SDL20_SetError)("Invalid number of frames");
        return iVar1;
      }
      iVar1 = (*SDL20_SetError)("Invalid number of tracks");
      return iVar1;
    }
    cdrom_local._4_4_ = (*SDL20_SetError)("Invalid start frame");
  }
  return cdrom_local._4_4_;
}

Assistant:

SDLCALL
SDL_CDPlayTracks(SDL12_CD *cdrom, int start_track, int start_frame, int ntracks, int nframes)
{
    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return -1;
    }
    if (cdrom->status == SDL12_CD_TRAYEMPTY) {
        return SDL20_SetError("Tray empty");
    }
    if ((start_track < 0) || (start_track >= cdrom->numtracks)) {
        return SDL20_SetError("Invalid start track");
    }
    if ((start_frame < 0) || (((Uint32) start_frame) >= cdrom->track[start_track].length)) {
        return SDL20_SetError("Invalid start frame");
    }
    if ((ntracks < 0) || ((start_track + ntracks) >= cdrom->numtracks)) {
        return SDL20_SetError("Invalid number of tracks");
    }
    if ((nframes < 0) || (((Uint32) nframes) >= cdrom->track[start_track + ntracks].length)) {
        return SDL20_SetError("Invalid number of frames");
    }

    if (!ntracks && !nframes) {
        ntracks = cdrom->numtracks - start_track;
        nframes = cdrom->track[cdrom->numtracks - 1].length;
    }

    return StartCDAudioPlaying(cdrom, start_track, start_frame, ntracks, nframes);
}